

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

ON_SubDRTreeVertexFinder *
ON_SubDRTreeVertexFinder::Create
          (ON_SubDRTreeVertexFinder *__return_storage_ptr__,ON_3dPoint P,bool bMarkFilter)

{
  ON_3dPoint P_00;
  double in_stack_ffffffffffffffc0;
  ON_SubDRTreeVertexFinder *vf;
  bool bMarkFilter_local;
  
  P_00.z = in_stack_ffffffffffffffc0;
  P_00.x = (double)SUB168(P._8_16_,0);
  P_00.y = (double)SUB168(P._8_16_,8);
  Create(P_00);
  __return_storage_ptr__->m_bMarkFilterEnabled = true;
  __return_storage_ptr__->m_bMarkFilter = bMarkFilter;
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDRTreeVertexFinder ON_SubDRTreeVertexFinder::Create(const ON_3dPoint P, bool bMarkFilter)
{
  ON_SubDRTreeVertexFinder vf = ON_SubDRTreeVertexFinder::Create(P);
  vf.m_bMarkFilterEnabled = true;
  vf.m_bMarkFilter = bMarkFilter;
  return vf;
}